

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void matchTok(int t)

{
  char local_78 [8];
  char msg [100];
  int t_local;
  
  if (lookahead == t) {
    lookahead = lexan();
  }
  else {
    describeLookahead(local_78,"improper syntax ");
    errmsg(local_78);
    sprintf(local_78,"expect match code: %d",(ulong)(uint)t);
    errmsg(local_78);
    ParseError = 1;
  }
  return;
}

Assistant:

void matchTok(int t) {
   if (lookahead == t) {
      lookahead = lexan();
   }
   else {
        char msg[100];
        describeLookahead(msg,"improper syntax ");
	errmsg(msg);
        sprintf(msg,"expect match code: %d", t);
        errmsg(msg);
	ParseError = TRUE;
   }
}